

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_JP2K.cpp
# Opt level: O0

MXFSReader * __thiscall
ASDCP::JP2K::MXFSReader::ReadFrame
          (MXFSReader *this,ui32_t FrameNum,StereoscopicPhase_t phase,FrameBuffer *FrameBuf,
          AESDecContext *Ctx,HMACContext *HMAC)

{
  h__SReader *phVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  long lVar3;
  AESDecContext *Ctx_local;
  FrameBuffer *FrameBuf_local;
  StereoscopicPhase_t phase_local;
  ui32_t FrameNum_local;
  MXFSReader *this_local;
  
  lVar3 = CONCAT44(in_register_00000034,FrameNum);
  phVar1 = ASDCP::mem_ptr::operator_cast_to_h__SReader_((mem_ptr *)(lVar3 + 8));
  if (phVar1 != (h__SReader *)0x0) {
    phVar1 = mem_ptr<ASDCP::JP2K::MXFSReader::h__SReader>::operator->
                       ((mem_ptr<ASDCP::JP2K::MXFSReader::h__SReader> *)(lVar3 + 8));
    uVar2 = (**(code **)(*(long *)(phVar1->super_lh__Reader).super_h__ASDCPReader.
                                  super_TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>
                                  .m_File + 0x40))();
    if ((uVar2 & 1) != 0) {
      phVar1 = mem_ptr<ASDCP::JP2K::MXFSReader::h__SReader>::operator->
                         ((mem_ptr<ASDCP::JP2K::MXFSReader::h__SReader> *)(lVar3 + 8));
      h__SReader::ReadFrame
                ((h__SReader *)this,(ui32_t)phVar1,phase,
                 (FrameBuffer *)((ulong)FrameBuf & 0xffffffff),Ctx,HMAC);
      return this;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::JP2K::MXFSReader::ReadFrame(ui32_t FrameNum, StereoscopicPhase_t phase, FrameBuffer& FrameBuf,
				   AESDecContext* Ctx, HMACContext* HMAC) const
{
  if ( m_Reader && m_Reader->m_File->IsOpen() )
    return m_Reader->ReadFrame(FrameNum, phase, FrameBuf, Ctx, HMAC);

  return RESULT_INIT;
}